

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void finish_example_scores<true>(vw *all,oaa *o,example *ec)

{
  float fVar1;
  int iVar2;
  code *pcVar3;
  float *pfVar4;
  ostream *poVar5;
  int **ppiVar6;
  long in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  double dVar7;
  substring sVar8;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  substring ss;
  uint32_t i_1;
  ostringstream outputStringStream;
  char temp_str [10];
  float zero_one_loss;
  uint32_t i;
  uint32_t prediction;
  float correct_class_prob;
  float multiclass_log_loss;
  example *in_stack_fffffffffffffd18;
  vw *in_stack_fffffffffffffd20;
  string local_240 [36];
  int local_21c;
  int *local_218;
  int *local_210;
  v_array<int> *local_208;
  allocator local_1f9;
  string local_1f8 [32];
  substring local_1d8;
  uint local_1b4;
  ostream local_1b0;
  char local_36 [10];
  float local_2c;
  uint local_28;
  uint local_24;
  float local_20;
  float local_1c;
  long local_18;
  ulong *local_10;
  long *local_8;
  
  local_1c = 999.0;
  local_20 = 0.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((ulong)*(uint *)(in_RDX + 0x6828) <= *in_RSI) {
    pfVar4 = v_array<float>::operator[]
                       ((v_array<float> *)(in_RDX + 0x6850),(ulong)(*(int *)(in_RDX + 0x6828) - 1));
    local_20 = *pfVar4;
  }
  if (0.0 < local_20) {
    dVar7 = std::log((double)(ulong)(uint)local_20);
    local_1c = -SUB84(dVar7,0) * *(float *)(local_18 + 0x6870);
  }
  if ((*(byte *)(local_18 + 0x68c8) & 1) == 0) {
    *(double *)(*local_8 + 0xc0) = (double)local_1c + *(double *)(*local_8 + 0xc0);
  }
  else {
    *(double *)(*local_8 + 200) = (double)local_1c + *(double *)(*local_8 + 200);
  }
  local_24 = 0;
  for (local_28 = 1; (ulong)local_28 < *local_10; local_28 = local_28 + 1) {
    pfVar4 = v_array<float>::operator[]((v_array<float> *)(local_18 + 0x6850),(ulong)local_28);
    fVar1 = *pfVar4;
    pfVar4 = v_array<float>::operator[]((v_array<float> *)(local_18 + 0x6850),(ulong)local_24);
    if (*pfVar4 <= fVar1 && fVar1 != *pfVar4) {
      local_24 = local_28;
    }
  }
  local_24 = local_24 + 1;
  local_2c = 0.0;
  if (*(int *)(local_18 + 0x6828) != local_24) {
    local_2c = *(float *)(local_18 + 0x6870);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  for (local_1b4 = 0; (ulong)local_1b4 < *local_10; local_1b4 = local_1b4 + 1) {
    if (local_1b4 != 0) {
      std::operator<<(&local_1b0,' ');
    }
    if (*(long *)(*local_8 + 0x70) == 0) {
      std::ostream::operator<<(&local_1b0,local_1b4 + 1);
    }
    else {
      sVar8 = namedlabels::get((namedlabels *)in_stack_fffffffffffffd20,
                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      local_1d8 = sVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f8,sVar8.begin,(long)sVar8.end - (long)sVar8.begin,&local_1f9);
      std::operator<<(&local_1b0,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    }
    pfVar4 = v_array<float>::operator[]((v_array<float> *)(local_18 + 0x6850),(ulong)local_1b4);
    sprintf(local_36,"%f",(double)*pfVar4);
    poVar5 = std::operator<<(&local_1b0,':');
    std::operator<<(poVar5,local_36);
  }
  local_208 = (v_array<int> *)(local_8 + 0x6a2);
  ppiVar6 = v_array<int>::begin(local_208);
  local_210 = *ppiVar6;
  ppiVar6 = v_array<int>::end(local_208);
  local_218 = *ppiVar6;
  for (; local_210 != local_218; local_210 = local_210 + 1) {
    iVar2 = *local_210;
    pcVar3 = (code *)local_8[0x6a8];
    local_21c = iVar2;
    std::__cxx11::ostringstream::str();
    in_stack_fffffffffffffd18 = *(example **)(local_18 + 0x6878);
    in_stack_fffffffffffffd20 = *(vw **)(local_18 + 0x6880);
    (*pcVar3)(iVar2,local_240);
    std::__cxx11::string::~string(local_240);
  }
  shared_data::update((shared_data *)*local_8,(bool)(*(byte *)(local_18 + 0x68c8) & 1),
                      *(int *)(local_18 + 0x6828) != -1,local_2c,*(float *)(local_18 + 0x6870),
                      *(size_t *)(local_18 + 0x68a0));
  MULTICLASS::print_update_with_probability(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0);
  VW::finish_example(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  return;
}

Assistant:

void finish_example_scores(vw& all, oaa& o, example& ec)
{
  // === Compute multiclass_log_loss
  // TODO:
  // What to do if the correct label is unknown, i.e. (uint32_t)-1?
  //   Suggestion: increase all.sd->weighted_unlabeled_examples???,
  //               but not sd.example_number, so the average loss is not influenced.
  // What to do if the correct_class_prob==0?
  //   Suggestion: have some maximal multiclass_log_loss limit, e.g. 999.
  float multiclass_log_loss = 999;  // -log(0) = plus infinity
  float correct_class_prob = 0;
  if (probabilities)
  {
    if (ec.l.multi.label <= o.k)  // prevent segmentation fault if labeĺ==(uint32_t)-1
      correct_class_prob = ec.pred.scalars[ec.l.multi.label - 1];
    if (correct_class_prob > 0)
      multiclass_log_loss = -log(correct_class_prob) * ec.weight;
    if (ec.test_only)
      all.sd->holdout_multiclass_log_loss += multiclass_log_loss;
    else
      all.sd->multiclass_log_loss += multiclass_log_loss;
  }
  // === Compute `prediction` and zero_one_loss
  // We have already computed `prediction` in predict_or_learn,
  // but we cannot store it in ec.pred union because we store ec.pred.probs there.
  uint32_t prediction = 0;
  for (uint32_t i = 1; i < o.k; i++)
    if (ec.pred.scalars[i] > ec.pred.scalars[prediction])
      prediction = i;
  prediction++;  // prediction is 1-based index (not 0-based)
  float zero_one_loss = 0;
  if (ec.l.multi.label != prediction)
    zero_one_loss = ec.weight;

  // === Print probabilities for all classes
  char temp_str[10];
  ostringstream outputStringStream;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (i > 0)
      outputStringStream << ' ';
    if (all.sd->ldict)
    {
      substring ss = all.sd->ldict->get(i + 1);
      outputStringStream << string(ss.begin, ss.end - ss.begin);
    }
    else
      outputStringStream << i + 1;
    sprintf(temp_str, "%f", ec.pred.scalars[i]);  // 0.123 -> 0.123000
    outputStringStream << ':' << temp_str;
  }
  for (int sink : all.final_prediction_sink) all.print_text(sink, outputStringStream.str(), ec.tag);

  // === Report updates using zero-one loss
  all.sd->update(ec.test_only, ec.l.multi.label != (uint32_t)-1, zero_one_loss, ec.weight, ec.num_features);
  // Alternatively, we could report multiclass_log_loss.
  // all.sd->update(ec.test_only, multiclass_log_loss, ec.weight, ec.num_features);
  // Even better would be to report both losses, but this would mean to increase
  // the number of columns and this would not fit narrow screens.
  // So let's report (average) multiclass_log_loss only in the final resume.

  // === Print progress report
  if (probabilities)
    MULTICLASS::print_update_with_probability(all, ec, prediction);
  else
    MULTICLASS::print_update_with_score(all, ec, prediction);
  VW::finish_example(all, ec);
}